

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SelectPrep(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  NameContext *pOuterNC_local;
  Select *p_local;
  Parse *pParse_local;
  
  if ((((pParse->db->mallocFailed == '\0') && ((p->selFlags & 0x80) == 0)) &&
      (sqlite3SelectExpand(pParse,p), pParse->nErr == 0)) &&
     (sqlite3ResolveSelectNames(pParse,p,pOuterNC), pParse->nErr == 0)) {
    sqlite3SelectAddTypeInfo(pParse,p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPrep(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for container */
){
  assert( p!=0 || pParse->db->mallocFailed );
  assert( pParse->db->pParse==pParse );
  if( pParse->db->mallocFailed ) return;
  if( p->selFlags & SF_HasTypeInfo ) return;
  sqlite3SelectExpand(pParse, p);
  if( pParse->nErr ) return;
  sqlite3ResolveSelectNames(pParse, p, pOuterNC);
  if( pParse->nErr ) return;
  sqlite3SelectAddTypeInfo(pParse, p);
}